

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSubdivSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,float tessellationRate,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  Node *pNVar7;
  int iVar8;
  SubdivMeshNode *this_00;
  Vec3fa *pVVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  uint theta;
  ulong uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float phif;
  uint p11_1;
  uint p11;
  uint p10;
  uint p00;
  ulong local_b8;
  float local_ac;
  float local_a8;
  float local_a4;
  size_t local_a0;
  ulong local_98;
  ulong local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  Ref<embree::SceneGraph::MaterialNode> local_80;
  float local_78;
  uint local_74;
  int local_70;
  int local_6c;
  float local_68;
  uint local_64;
  ulong local_60;
  long local_58;
  Node *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_a8 = radius;
  local_a0 = N;
  local_50 = (Node *)this;
  this_00 = (SubdivMeshNode *)::operator_new(0x1b0);
  local_80 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_80.ptr != (MaterialNode *)0x0) {
    (*((local_80.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SubdivMeshNode::SubdivMeshNode(this_00,&local_80,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_80.ptr != (MaterialNode *)0x0) {
    (*((local_80.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar17 = (int)local_a0 * 2;
  local_b8 = (ulong)uVar17;
  uVar20 = 0;
  uVar21 = 0;
  uVar22 = 0;
  this_00->tessellationRate = tessellationRate;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (ulong)(((int)local_a0 + 1) * uVar17);
  uVar11 = pvVar4->size_alloced;
  uVar15 = uVar11;
  if ((uVar11 < uVar16) && (uVar14 = uVar11, uVar15 = uVar16, uVar11 != 0)) {
    for (; uVar15 = uVar14, uVar14 < uVar16; uVar14 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0)) {
    }
  }
  if (uVar16 < pvVar4->size_active) {
    pvVar4->size_active = uVar16;
  }
  if (uVar11 == uVar15) {
    pvVar4->size_active = uVar16;
  }
  else {
    ptr = pvVar4->items;
    pVVar9 = (Vec3fa *)alignedMalloc(uVar15 << 4,0x10);
    pvVar4->items = pVVar9;
    lVar10 = 0;
    for (uVar11 = 0; uVar11 < pvVar4->size_active; uVar11 = uVar11 + 1) {
      puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar10);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar10 = lVar10 + 0x10;
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar16;
    pvVar4->size_alloced = uVar15;
    uVar20 = extraout_XMM0_Db;
    uVar21 = extraout_XMM0_Dc;
    uVar22 = extraout_XMM0_Dd;
  }
  local_48 = local_b8 & 0xffffffff;
  fVar18 = (float)local_48;
  auVar23._4_4_ = uVar20;
  auVar23._0_4_ = fVar18;
  auVar23._8_4_ = uVar21;
  auVar23._12_4_ = uVar22;
  auVar24._4_4_ = uVar20;
  auVar24._0_4_ = fVar18;
  auVar24._8_4_ = uVar21;
  auVar24._12_4_ = uVar22;
  auVar24 = rcpss(auVar23,auVar24);
  local_68 = (2.0 - fVar18 * auVar24._0_4_) * auVar24._0_4_;
  fVar18 = (float)(local_a0 & 0xffffffff);
  auVar25._4_4_ = uVar20;
  auVar25._0_4_ = fVar18;
  auVar25._8_4_ = uVar21;
  auVar25._12_4_ = uVar22;
  auVar5._4_4_ = uVar20;
  auVar5._0_4_ = fVar18;
  auVar5._8_4_ = uVar21;
  auVar5._12_4_ = uVar22;
  auVar24 = rcpss(auVar25,auVar5);
  local_78 = (2.0 - fVar18 * auVar24._0_4_) * auVar24._0_4_;
  iVar8 = (int)local_b8;
  local_38 = (ulong)(iVar8 - 1);
  local_88 = &this_00->verticesPerFace;
  this_01 = &this_00->position_indices;
  local_74 = iVar8 * (int)local_a0;
  local_40 = (ulong)(uint)(((int)local_a0 + -1) * iVar8);
  local_6c = iVar8 + 1;
  local_60 = (ulong)(uint)-iVar8;
  local_90 = 0;
  local_58 = 0;
  uVar11 = 0;
  while( true ) {
    uVar15 = local_48;
    pNVar7 = local_50;
    if ((uint)local_a0 < (uint)uVar11) break;
    fVar18 = (float)uVar11 * 3.1415927 * local_78;
    local_70 = (uint)uVar11 * (uint)local_b8;
    local_98 = uVar11;
    for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      local_a4 = ((float)(uVar16 & 0xffffffff) + (float)(uVar16 & 0xffffffff)) * 3.1415927 *
                 local_68;
      fVar3 = (center->field_0).m128[0];
      local_ac = sinf(fVar18);
      local_ac = local_ac * local_a8;
      fVar19 = sinf(local_a4);
      uVar17 = (int)local_58 + (int)uVar16;
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar17].field_0.m128[0] =
           fVar19 * local_ac + fVar3;
      fVar3 = (center->field_0).m128[1];
      fVar19 = cosf(fVar18);
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar17].field_0.m128[1] =
           fVar19 * local_a8 + fVar3;
      fVar3 = (center->field_0).m128[2];
      local_ac = sinf(fVar18);
      local_ac = local_ac * local_a8;
      fVar19 = cosf(local_a4);
      ((this_00->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar17].field_0.m128[2] =
           fVar19 * local_ac + fVar3;
    }
    if ((int)local_98 != 0) {
      uVar11 = local_98 & 0xffffffff;
      if ((int)local_98 == 1) {
        while (iVar8 = (int)uVar11, local_6c != iVar8) {
          p00 = (uint)local_38;
          p10 = p00 + iVar8;
          p11 = (int)(uVar11 % (local_b8 & 0xffffffff)) + (int)local_b8;
          p11_1 = 3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (local_88,&p11_1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p10);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p11);
          uVar11 = (ulong)(iVar8 + 1);
        }
      }
      else if ((int)local_98 == (uint)local_a0) {
        uVar17 = 0;
        while ((uint)local_b8 != uVar17) {
          p00 = (int)local_40 + uVar17;
          uVar17 = uVar17 + 1;
          p10 = uVar17 % (uint)local_b8 + (int)local_40;
          p11 = local_74;
          p11_1 = 3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (local_88,&p11_1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p11);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p10);
        }
      }
      else {
        iVar8 = ((int)local_98 + -1) * (uint)local_b8;
        uVar11 = 1;
        uVar15 = local_90;
        for (iVar13 = 0; (int)local_60 != iVar13; iVar13 = iVar13 + -1) {
          uVar17 = (uint)uVar15;
          p00 = (int)local_60 + uVar17;
          iVar12 = (int)(uVar11 % (local_b8 & 0xffffffff));
          p10 = iVar8 + iVar12;
          p11_1 = iVar12 + local_70;
          local_64 = 4;
          p11 = uVar17;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (local_88,&local_64);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p11);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p10);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&p11_1);
          uVar11 = (ulong)((int)uVar11 + 1);
          uVar15 = (ulong)(uVar17 + 1);
        }
      }
    }
    uVar11 = (ulong)((int)local_98 + 1);
    local_58 = local_58 + local_48;
    local_90 = (ulong)((int)local_90 + (uint)local_b8);
  }
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar7;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSubdivSphere (const Vec3fa& center, const float radius, size_t N, float tessellationRate, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),1);
    mesh->tessellationRate = tessellationRate;
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp((float)numTheta);
    const float rcpNumPhi   = rcp((float)numPhi);
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p11);
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(4);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
          mesh->position_indices.push_back(p11);
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }